

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall
rlottie::internal::renderer::Group::addChildren(Group *this,Group *data,VArenaAlloc *allocator)

{
  pointer ppOVar1;
  pointer ppOVar2;
  GradientStroke *local_40;
  GradientStroke *local_38;
  
  if (data != (Group *)0x0) {
    ppOVar1 = (data->mChildren).
              super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppOVar2 = (data->mChildren).
              super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppOVar1 != ppOVar2) {
      std::
      vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
      ::reserve(&this->mContents,(long)ppOVar2 - (long)ppOVar1 >> 3);
      ppOVar2 = (data->mChildren).
                super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; ppOVar2 !=
           (data->mChildren).
           super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
           ._M_impl.super__Vector_impl_data._M_start; ppOVar2 = ppOVar2 + -1) {
      local_40 = (GradientStroke *)ppOVar2[-1];
      local_38 = (GradientStroke *)allocator;
      switch((((anon_union_16_2_e89eba29_for_Object_1 *)&local_40->super_Gradient)->mData)._type) {
      case Group:
        local_38 = (GradientStroke *)
                   VArenaAlloc::
                   make<rlottie::internal::renderer::Group,rlottie::internal::model::Group*,VArenaAlloc*&>
                             (allocator,(Group **)&local_40,(VArenaAlloc **)&local_38);
        break;
      default:
        goto switchD_00125e34_caseD_4;
      case Fill:
        local_38 = (GradientStroke *)
                   VArenaAlloc::
                   make<rlottie::internal::renderer::Fill,rlottie::internal::model::Fill*>
                             (allocator,(Fill **)&local_40);
        break;
      case Stroke:
        local_38 = (GradientStroke *)
                   VArenaAlloc::
                   make<rlottie::internal::renderer::Stroke,rlottie::internal::model::Stroke*>
                             (allocator,(Stroke **)&local_40);
        break;
      case GFill:
        local_38 = (GradientStroke *)
                   VArenaAlloc::
                   make<rlottie::internal::renderer::GradientFill,rlottie::internal::model::GradientFill*>
                             (allocator,(GradientFill **)&local_40);
        break;
      case GStroke:
        local_38 = VArenaAlloc::
                   make<rlottie::internal::renderer::GradientStroke,rlottie::internal::model::GradientStroke*>
                             (allocator,&local_40);
        break;
      case Rect:
        local_38 = (GradientStroke *)
                   VArenaAlloc::
                   make<rlottie::internal::renderer::Rect,rlottie::internal::model::Rect*>
                             (allocator,(Rect **)&local_40);
        break;
      case Ellipse:
        local_38 = (GradientStroke *)
                   VArenaAlloc::
                   make<rlottie::internal::renderer::Ellipse,rlottie::internal::model::Ellipse*>
                             (allocator,(Ellipse **)&local_40);
        break;
      case Path:
        local_38 = (GradientStroke *)
                   VArenaAlloc::
                   make<rlottie::internal::renderer::Path,rlottie::internal::model::Path*>
                             (allocator,(Path **)&local_40);
        break;
      case Polystar:
        local_38 = (GradientStroke *)
                   VArenaAlloc::
                   make<rlottie::internal::renderer::Polystar,rlottie::internal::model::Polystar*>
                             (allocator,(Polystar **)&local_40);
        break;
      case Trim:
        local_38 = (GradientStroke *)
                   VArenaAlloc::
                   make<rlottie::internal::renderer::Trim,rlottie::internal::model::Trim*>
                             (allocator,(Trim **)&local_40);
        break;
      case Repeater:
        local_38 = (GradientStroke *)
                   VArenaAlloc::
                   make<rlottie::internal::renderer::Repeater,rlottie::internal::model::Repeater*,VArenaAlloc*&>
                             (allocator,(Repeater **)&local_40,(VArenaAlloc **)&local_38);
      }
      if (local_38 != (GradientStroke *)0x0) {
        std::
        vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
        ::push_back(&this->mContents,(value_type *)&local_38);
      }
switchD_00125e34_caseD_4:
    }
  }
  return;
}

Assistant:

void renderer::Group::addChildren(model::Group *data, VArenaAlloc *allocator)
{
    if (!data) return;

    if (!data->mChildren.empty()) mContents.reserve(data->mChildren.size());

    // keep the content in back-to-front order.
    // as lottie model keeps it in front-to-back order.
    for (auto it = data->mChildren.crbegin(); it != data->mChildren.rend();
         ++it) {
        auto content = createContentItem(*it, allocator);
        if (content) {
            mContents.push_back(content);
        }
    }
}